

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

Hashtable * __thiscall icu_63::NFFactory::getSupportedIDs(NFFactory *this,UErrorCode *status)

{
  uint in_EAX;
  int iVar1;
  undefined4 extraout_var;
  Hashtable *pHVar2;
  long lVar3;
  code *this_00;
  UHashtable *pUVar4;
  int32_t count;
  undefined1 auStack_38 [8];
  UnicodeString *that;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->_ids != (Hashtable *)0x0) {
      return this->_ids;
    }
    this_00 = (code *)(auStack_38 + 4);
    auStack_38._4_4_ = 0;
    auStack_38._0_4_ = in_EAX;
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[4])(this->_delegate,this_00,status);
    that = (UnicodeString *)CONCAT44(extraout_var,iVar1);
    pHVar2 = (Hashtable *)UMemory::operator_new((UMemory *)0x58,(size_t)this_00);
    if (pHVar2 != (Hashtable *)0x0) {
      pHVar2->hash = (UHashtable *)0x0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar4 = &pHVar2->hashObj;
        this_00 = uhash_hashUnicodeString_63;
        uhash_init_63(pUVar4,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                      (undefined1 *)0x0,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pHVar2->hash = pUVar4;
          this_00 = uprv_deleteUObject_63;
          uhash_setKeyDeleter_63(pUVar4,uprv_deleteUObject_63);
        }
      }
      this->_ids = pHVar2;
      if ((int)auStack_38._4_4_ < 1) {
        return pHVar2;
      }
      lVar3 = 0;
      do {
        pUVar4 = this->_ids->hash;
        this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
        if ((UnicodeString *)this_00 != (UnicodeString *)0x0) {
          icu_63::UnicodeString::UnicodeString((UnicodeString *)this_00,that);
        }
        uhash_put_63(pUVar4,this_00,this,status);
        lVar3 = lVar3 + 1;
        that = that + 1;
      } while (lVar3 < (int)auStack_38._4_4_);
      return this->_ids;
    }
    this->_ids = (Hashtable *)0x0;
  }
  return (Hashtable *)0x0;
}

Assistant:

UnicodeString&
NumberFormat::format(double number, UnicodeString& appendTo) const
{
    FieldPosition pos(FieldPosition::DONT_CARE);
    return format(number, appendTo, pos);
}